

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O1

int CVmBifTIO::map_raw_key(char *namebuf,char *c,size_t len)

{
  char cVar1;
  size_t outlen;
  char *local_18;
  undefined8 local_10;
  
  if ((len != 1) || (cVar1 = *c, cVar1 != '\x7f' && 0x1a < (byte)(cVar1 - 1U))) {
    local_10 = 0x20;
    local_18 = namebuf;
    (*(G_cmap_from_ui_X->super_CCharmap)._vptr_CCharmap[4])
              (G_cmap_from_ui_X,&local_18,&local_10,c,len);
    *local_18 = '\0';
    return 1;
  }
  switch(cVar1) {
  case '\t':
    namebuf[0] = '\t';
    namebuf[1] = '\0';
    break;
  case '\n':
  case '\r':
    namebuf[0] = '\n';
    namebuf[1] = '\0';
    break;
  case '\v':
  case '\f':
switchD_00230b7c_caseD_b:
    namebuf[0] = '[';
    namebuf[1] = 'c';
    namebuf[2] = 't';
    namebuf[3] = 'r';
    namebuf[4] = 'l';
    namebuf[5] = '-';
    namebuf[6] = '?';
    namebuf[7] = ']';
    namebuf[8] = '\0';
    namebuf[6] = *c + '`';
    break;
  default:
    if (cVar1 == '\x1b') {
      builtin_strncpy(namebuf,"[esc]",6);
      return 1;
    }
    if (cVar1 != '\x7f') goto switchD_00230b7c_caseD_b;
  case '\b':
    builtin_strncpy(namebuf,"[bksp]",7);
  }
  return 1;
}

Assistant:

int CVmBifTIO::map_raw_key(VMG_ char *namebuf, const char *c, size_t len)
{
    size_t outlen;

    /* if it's a control character, give it a portable key name */
    if (len == 1 && ((c[0] >= 1 && c[0] <= 27) || c[0] == 127))
    {
        switch(c[0])
        {
        case 10:
        case 13:
            /* 
             *   return an ASCII 10 (regardless of local newline conventions
             *   - this is the internal string representation, which we
             *   define to use ASCII 10 to represent a newline everywhere) 
             */
            namebuf[0] = 10;
            namebuf[1] = '\0';
            return TRUE;

        case 9:
            /* return ASCII 9 for TAB characters */
            namebuf[0] = 9;
            namebuf[1] = '\0';
            return TRUE;

        case 8:
        case 127:
            /* return '[bksp]' for backspace/del characters */
            strcpy(namebuf, "[bksp]");
            return TRUE;

        case 27:
            /* return '[esc]' for the escape key */
            strcpy(namebuf, "[esc]");
            return TRUE;

        default:
            /* return '[ctrl-X]' for other control characters */
            strcpy(namebuf, "[ctrl-?]");
            namebuf[6] = (char)(c[0] + 'a' - 1);
            return TRUE;
        }
    }

    /* map the character to wide Unicode */
    outlen = 32;
    G_cmap_from_ui->map(&namebuf, &outlen, c, len);

    /* null-terminate the result */
    *namebuf = '\0';

    /* successfully mapped */
    return TRUE;
}